

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartSharedAttributes.cpp
# Opt level: O0

void (anonymous_namespace)::testDiskAttrValue<Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>>
               (Header *diskHeader,TypedAttribute<Imf_3_2::Chromaticities> *testAttribute)

{
  byte bVar1;
  undefined8 uVar2;
  long lVar3;
  Chromaticities *this;
  Chromaticities *pCVar4;
  InputExc *this_00;
  long *in_RSI;
  string *in_RDI;
  TypedAttribute<Imf_3_2::Chromaticities> *diskAttr;
  string *attrName;
  allocator<char> *__a;
  char *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb0;
  allocator<char> local_39;
  string local_38 [32];
  string *local_18;
  string *local_8;
  
  local_8 = in_RDI;
  (**(code **)(*in_RSI + 0x10))();
  __a = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,__a);
  std::allocator<char>::~allocator(&local_39);
  local_18 = local_38;
  uVar2 = Imf_3_2::Header::operator[](local_8);
  lVar3 = __dynamic_cast(uVar2,&Imf_3_2::Attribute::typeinfo,
                         &Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::typeinfo,0);
  if (lVar3 == 0) {
    __cxa_bad_cast();
  }
  this = (Chromaticities *)Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::value();
  pCVar4 = (Chromaticities *)Imf_3_2::TypedAttribute<Imf_3_2::Chromaticities>::value();
  bVar1 = Imf_3_2::Chromaticities::operator!=(this,pCVar4);
  if ((bVar1 & 1) == 0) {
    std::__cxx11::string::~string(local_38);
    return;
  }
  this_00 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::InputExc::InputExc(this_00,"incorrect value from disk");
  __cxa_throw(this_00,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
}

Assistant:

void
testDiskAttrValue (const Header& diskHeader, const T& testAttribute)
{
    const string& attrName = testAttribute.typeName ();
    const T&      diskAttr = dynamic_cast<const T&> (diskHeader[attrName]);
    if (diskAttr.value () != testAttribute.value ())
    {
        throw IEX_NAMESPACE::InputExc ("incorrect value from disk");
    }

    return;
}